

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O0

void __thiscall CMU462::Camera::set_screen_size(Camera *this,size_t screenW,size_t screenH)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  size_t screenH_local;
  size_t screenW_local;
  Camera *this_local;
  undefined4 uVar5;
  undefined4 uVar7;
  
  this->screenW = screenW;
  this->screenH = screenH;
  uVar5 = (undefined4)(screenW >> 0x20);
  auVar2._8_4_ = uVar5;
  auVar2._0_8_ = screenW;
  auVar2._12_4_ = 0x45300000;
  uVar7 = (undefined4)(screenH >> 0x20);
  auVar6._8_4_ = uVar7;
  auVar6._0_8_ = screenH;
  auVar6._12_4_ = 0x45300000;
  this->ar = ((auVar2._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)screenW) - 4503599627370496.0)) /
             ((auVar6._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)screenH) - 4503599627370496.0));
  auVar3._8_4_ = uVar5;
  auVar3._0_8_ = screenW;
  auVar3._12_4_ = 0x45300000;
  dVar1 = atan(((auVar3._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)screenW) - 4503599627370496.0)) /
               (this->screenDist + this->screenDist));
  dVar1 = degrees<double>(dVar1);
  this->hFov = dVar1 + dVar1;
  auVar4._8_4_ = uVar7;
  auVar4._0_8_ = screenH;
  auVar4._12_4_ = 0x45300000;
  dVar1 = atan(((auVar4._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)screenH) - 4503599627370496.0)) /
               (this->screenDist * 2.0));
  dVar1 = degrees<double>(dVar1);
  this->vFov = dVar1 * 2.0;
  return;
}

Assistant:

void Camera::set_screen_size(const size_t screenW, const size_t screenH) {
    this->screenW = screenW;
    this->screenH = screenH;
    ar = 1.0 * screenW / screenH;
    hFov = 2 * degrees(atan(((double) screenW) / (2 * screenDist)));
    vFov = 2 * degrees(atan(((double) screenH) / (2 * screenDist)));
  }